

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O0

void __thiscall Node::~Node(Node *this)

{
  Node *in_RDI;
  
  ~Node(in_RDI);
  operator_delete(in_RDI,0x80);
  return;
}

Assistant:

virtual ~Node() = default;